

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

string * __thiscall
cmCTestHG::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestHG *this)

{
  char *hg_identify [4];
  OutputLogger err;
  IdentifyParser out;
  pointer local_188;
  char *local_180;
  char *local_178;
  undefined8 local_170;
  LineParser local_168;
  IdentifyParser local_128;
  
  local_188 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_180 = "identify";
  local_178 = "-i";
  local_170 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  IdentifyParser::IdentifyParser(&local_128,this,"rev-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_168,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "rev-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_188,(OutputParser *)&local_128,
                      &local_168.super_OutputParser,(char *)0x0);
  cmProcessTools::LineParser::~LineParser(&local_168);
  IdentifyParser::~IdentifyParser(&local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestHG::GetWorkingRevision()
{
  // Run plumbing "hg identify" to get work tree revision.
  const char* hg = this->CommandLineTool.c_str();
  const char* hg_identify[] = {hg, "identify","-i", 0};
  std::string rev;
  IdentifyParser out(this, "rev-out> ", rev);
  OutputLogger err(this->Log, "rev-err> ");
  this->RunChild(hg_identify, &out, &err);
  return rev;
}